

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O3

Matrix * __thiscall Layer::get(Matrix *__return_storage_ptr__,Layer *this)

{
  pointer pPVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  Matrix::Matrix(__return_storage_ptr__,1,
                 (int)((ulong)((long)(this->m_perceptrons).
                                     super__Vector_base<Perceptron,_std::allocator<Perceptron>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->m_perceptrons).
                                    super__Vector_base<Perceptron,_std::allocator<Perceptron>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333);
  pPVar1 = (this->m_perceptrons).super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->m_perceptrons).super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar1) {
    uVar4 = 0;
    do {
      dVar5 = Perceptron::get_output(pPVar1 + uVar4);
      pdVar2 = Matrix::set(__return_storage_ptr__,0,(uint)uVar4);
      *pdVar2 = dVar5;
      uVar4 = (ulong)((uint)uVar4 + 1);
      pPVar1 = (this->m_perceptrons).super__Vector_base<Perceptron,_std::allocator<Perceptron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->m_perceptrons).
                     super__Vector_base<Perceptron,_std::allocator<Perceptron>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pPVar1 >> 4) * -0x3333333333333333;
    } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Layer::get() const{
    Matrix mat(1, m_perceptrons.size());

    for(uint i=0;i<m_perceptrons.size();++i) mat.set(0, i)=m_perceptrons[i].get_output();

    return mat;
}